

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O3

double __thiscall pfederc::LogMessage::log(LogMessage *this,double __x)

{
  pointer pLVar1;
  char extraout_AL;
  Logger *in_RSI;
  LogMessage *msg;
  pointer this_00;
  double __x_00;
  
  __x_00 = Logger::log(in_RSI,__x);
  if (extraout_AL != '\0') {
    pLVar1 = (this->msgs).
             super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (this->msgs).
                   super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_00 != pLVar1;
        this_00 = this_00 + 1) {
      __x_00 = log(this_00,__x_00);
    }
  }
  return __x_00;
}

Assistant:

void LogMessage::log(Logger &log) const noexcept {
  if (!log.log(getLogLevel(), getMessage()))
    return;

  for (const LogMessage &msg : getMessages()) {
    msg.log(log);
  }
}